

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  uint uVar1;
  uint32_t *puVar2;
  uint local_78;
  uint32_t local_74;
  uint local_5c;
  uint32_t delta;
  uint32_t len;
  uint8_t *pb;
  uint32_t *pair;
  uint32_t len1;
  uint32_t len0;
  uint32_t *ptr1;
  uint32_t *ptr0;
  uint32_t *son_local;
  uint32_t depth_local;
  uint32_t cur_match_local;
  uint8_t *cur_local;
  uint32_t pos_local;
  uint32_t len_limit_local;
  
  _len1 = son + (cyclic_pos << 1);
  pair._4_4_ = 0;
  pair._0_4_ = 0;
  ptr1 = son + (ulong)(cyclic_pos << 1) + 1;
  son_local._0_4_ = depth;
  son_local._4_4_ = cur_match;
  do {
    uVar1 = pos - son_local._4_4_;
    if (((uint32_t)son_local == 0) || (cyclic_size <= uVar1)) {
      *ptr1 = 0;
      *_len1 = 0;
      return matches;
    }
    if (cyclic_pos < uVar1) {
      local_74 = cyclic_size;
    }
    else {
      local_74 = 0;
    }
    puVar2 = son + ((cyclic_pos - uVar1) + local_74) * 2;
    if (pair._4_4_ < (uint)pair) {
      local_78 = pair._4_4_;
    }
    else {
      local_78 = (uint)pair;
    }
    local_5c = local_78;
    if (cur[(ulong)local_78 - (ulong)uVar1] == cur[local_78]) {
      do {
        local_5c = local_5c + 1;
        if (local_5c == len_limit) break;
      } while (cur[(ulong)local_5c - (ulong)uVar1] == cur[local_5c]);
      if (len_best < local_5c) {
        matches->len = local_5c;
        matches->dist = uVar1 - 1;
        matches = matches + 1;
        len_best = local_5c;
        if (local_5c == len_limit) {
          *_len1 = *puVar2;
          *ptr1 = puVar2[1];
          return matches;
        }
      }
    }
    if (cur[(ulong)local_5c - (ulong)uVar1] < cur[local_5c]) {
      *_len1 = son_local._4_4_;
      _len1 = puVar2 + 1;
      son_local._4_4_ = *_len1;
      pair._0_4_ = local_5c;
      son_local._0_4_ = (uint32_t)son_local - 1;
    }
    else {
      *ptr1 = son_local._4_4_;
      son_local._4_4_ = *puVar2;
      pair._4_4_ = local_5c;
      ptr1 = puVar2;
      son_local._0_4_ = (uint32_t)son_local - 1;
    }
  } while( true );
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		uint32_t *pair;
		const uint8_t *pb;
		uint32_t len;

		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		pb = cur - delta;
		len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			while (++len != len_limit)
				if (pb[len] != cur[len])
					break;

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}